

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  char in_SIL;
  undefined8 in_R8;
  uint in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int src0_stride_00;
  undefined4 in_stack_ffffffffffffffe0;
  int which_inverse;
  uint7 in_stack_fffffffffffffff0;
  
  src0_stride_00 = (int)((ulong)in_R8 >> 0x20);
  which_inverse = (int)((ulong)in_RDX >> 0x20);
  if (in_SIL == '\0') {
    diffwtd_mask((uint8_t *)(ulong)in_stack_fffffffffffffff0,which_inverse,(int)in_RDX,
                 (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),src0_stride_00,
                 (uint8_t *)((ulong)in_R9D << 0x20),unaff_retaddr,in_stack_00000008,
                 in_stack_00000010);
  }
  else if (in_SIL == '\x01') {
    diffwtd_mask((uint8_t *)CONCAT17(1,in_stack_fffffffffffffff0),which_inverse,(int)in_RDX,
                 (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),src0_stride_00,
                 (uint8_t *)CONCAT44(in_R9D,1),unaff_retaddr,in_stack_00000008,in_stack_00000010);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_c(uint8_t *mask,
                                       DIFFWTD_MASK_TYPE mask_type,
                                       const uint8_t *src0, int src0_stride,
                                       const uint8_t *src1, int src1_stride,
                                       int h, int w) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask(mask, 0, 38, src0, src0_stride, src1, src1_stride, h, w);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask(mask, 1, 38, src0, src0_stride, src1, src1_stride, h, w);
      break;
    default: assert(0);
  }
}